

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

QStringList * __thiscall
QCommandLineParser::unknownOptionNames(QStringList *__return_storage_ptr__,QCommandLineParser *this)

{
  QCommandLineParserPrivate *pQVar1;
  Data *pDVar2;
  
  if (this->d->needsParsing == true) {
    unknownOptionNames();
  }
  pQVar1 = this->d;
  pDVar2 = (pQVar1->unknownOptionNames).d.d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (pQVar1->unknownOptionNames).d.ptr;
  (__return_storage_ptr__->d).size = (pQVar1->unknownOptionNames).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineParser::unknownOptionNames() const
{
    d->checkParsed("unknownOptionNames");
    return d->unknownOptionNames;
}